

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_mcode.c
# Opt level: O3

void lj_mcode_free(jit_State *J)

{
  MCode *base;
  MCode *pMVar1;
  size_t sz;
  
  base = J->mcarea;
  J->mcarea = (MCode *)0x0;
  J->szallmcarea = 0;
  while (base != (MCode *)0x0) {
    pMVar1 = *(MCode **)base;
    sz = *(size_t *)(base + 8);
    lj_err_deregister_mcode(base,sz,base + 0x10);
    munmap(base,sz);
    base = pMVar1;
  }
  return;
}

Assistant:

void lj_mcode_free(jit_State *J)
{
  MCode *mc = J->mcarea;
  J->mcarea = NULL;
  J->szallmcarea = 0;
  while (mc) {
    MCode *next = ((MCLink *)mc)->next;
    size_t sz = ((MCLink *)mc)->size;
    lj_err_deregister_mcode(mc, sz, (uint8_t *)mc + sizeof(MCLink));
    mcode_free(J, mc, sz);
    mc = next;
  }
}